

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::MediumInterface
          (ParsedScene *this,string *insideName,string *outsideName,FileLoc loc)

{
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[16]>((FileLoc *)this,(char *)insideName,(char (*) [16])outsideName);
  }
  else {
    std::__cxx11::string::operator=(*(string **)(in_RDI + 0xac0),in_RSI);
    std::__cxx11::string::operator=((string *)(*(long *)(in_RDI + 0xac0) + 0x20),in_RDX);
  }
  return;
}

Assistant:

void ParsedScene::MediumInterface(const std::string &insideName,
                                  const std::string &outsideName, FileLoc loc) {
    VERIFY_INITIALIZED("MediumInterface");
    graphicsState->currentInsideMedium = insideName;
    graphicsState->currentOutsideMedium = outsideName;
}